

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gerr.hpp
# Opt level: O1

bool gerr::IsCode<gerr::details::IError,void>(int code,shared_ptr<gerr::details::IError> *err)

{
  long local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  AsCode<gerr::details::IError,void>((gerr *)&local_20,code,err);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return local_20 != 0;
}

Assistant:

bool IsCode(int code, std::shared_ptr<ErrType> const& err) {
  return AsCode(code, err) != nullptr;
}